

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkRestrashZero(Abc_Ntk_t *pNtk,int fCleanup)

{
  Abc_Aig_t *pMan;
  Nm_Man_t *p;
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *p1;
  Abc_Obj_t *pAVar4;
  char *pName;
  Abc_Ntk_t *pAVar5;
  uint local_3c;
  int Counter;
  int nNodes;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkAig;
  int fCleanup_local;
  Abc_Ntk_t *pNtk_local;
  
  local_3c = 0;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0xbc,"Abc_Ntk_t *Abc_NtkRestrashZero(Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    printf("Warning: The choice nodes in the original AIG are removed by strashing.\n");
  }
  pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), Counter < iVar1; Counter = Counter + 1) {
    pAVar3 = Abc_NtkBox(pNtk,Counter);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) {
      iVar1 = Abc_LatchIsInitDc(pAVar3);
      if (iVar1 == 0) {
        iVar1 = Abc_LatchIsInit1(pAVar3);
        if (iVar1 != 0) {
          pAVar4 = Abc_ObjFanout0(pAVar3);
          pAVar4 = Abc_ObjNot((pAVar4->field_6).pCopy);
          pAVar3 = Abc_ObjFanout0(pAVar3);
          (pAVar3->field_6).pCopy = pAVar4;
        }
      }
      else {
        local_3c = local_3c + 1;
      }
    }
  }
  if (local_3c != 0) {
    printf("Converting %d flops from don\'t-care to zero initial value.\n",(ulong)local_3c);
  }
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pAVar3 = Abc_NtkObj(pNtk,Counter);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
      pMan = (Abc_Aig_t *)pNtk_local->pManFunc;
      pAVar4 = Abc_ObjChild0Copy(pAVar3);
      p1 = Abc_ObjChild1Copy(pAVar3);
      pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
      (pAVar3->field_6).pCopy = pAVar4;
    }
  }
  Abc_NtkFinalize(pNtk,pNtk_local);
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk_local->vBoxes), Counter < iVar1; Counter = Counter + 1)
  {
    pAVar3 = Abc_NtkBox(pNtk_local,Counter);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if ((iVar1 != 0) && (iVar1 = Abc_LatchIsInit1(pAVar3), iVar1 != 0)) {
      pAVar4 = Abc_ObjFanin0(pAVar3);
      Abc_ObjXorFaninC(pAVar4,0);
      pAVar4 = Abc_ObjFanout0(pAVar3);
      pAVar4 = Abc_NodeFindCoFanout(pAVar4);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        p = pAVar3->pNtk->pManName;
        pAVar4 = Abc_ObjFanout0(pAVar3);
        Nm_ManDeleteIdName(p,pAVar4->Id);
        pAVar4 = Abc_ObjFanout0(pAVar3);
        pAVar3 = Abc_ObjFanout0(pAVar3);
        pName = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar4,pName,"_inv");
      }
    }
  }
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk_local->vBoxes), Counter < iVar1; Counter = Counter + 1)
  {
    pAVar3 = Abc_NtkBox(pNtk_local,Counter);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) {
      Abc_LatchSetInit0(pAVar3);
    }
  }
  if ((fCleanup != 0) && (uVar2 = Abc_AigCleanup((Abc_Aig_t *)pNtk_local->pManFunc), uVar2 != 0)) {
    printf("Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n",(ulong)uVar2);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar5 = Abc_NtkDup(pNtk->pExdc);
    pNtk_local->pExdc = pAVar5;
  }
  if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
    Abc_NtkTransferNameIds(pNtk,pNtk_local);
  }
  if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
    Abc_NtkUpdateNameIds(pNtk_local);
  }
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkStrash: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashZero( Abc_Ntk_t * pNtk, int fCleanup )
{
//    extern int timeRetime;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i, nNodes;//, RetValue;
    int Counter = 0;
    assert( Abc_NtkIsStrash(pNtk) );
//timeRetime = Abc_Clock();
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // complement the 1-values registers
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        if ( Abc_LatchIsInitDc(pObj) )
            Counter++;
        else if ( Abc_LatchIsInit1(pObj) )
            Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNot(Abc_ObjFanout0(pObj)->pCopy);
    }
    if ( Counter )
    printf( "Converting %d flops from don't-care to zero initial value.\n", Counter );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // complement the 1-valued registers
    Abc_NtkForEachLatch( pNtkAig, pObj, i )
        if ( Abc_LatchIsInit1(pObj) )
        {
            Abc_ObjXorFaninC( Abc_ObjFanin0(pObj), 0 );
            // if latch has PO as one of its fanouts change latch name
            if ( Abc_NodeFindCoFanout( Abc_ObjFanout0(pObj) ) )
            {
                Nm_ManDeleteIdName( pObj->pNtk->pManName, Abc_ObjFanout0(pObj)->Id );
                Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjName(Abc_ObjFanout0(pObj)), "_inv" );
            }
        }
    // set all constant-0 values
    Abc_NtkForEachLatch( pNtkAig, pObj, i )
        Abc_LatchSetInit0( pObj );

    // print warning about self-feed latches
//    if ( Abc_NtkCountSelfFeedLatches(pNtkAig) )
//        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtkAig) );
    // perform cleanup if requested
    if ( fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
        printf( "Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // transfer name IDs
    if ( pNtk->vNameIds )
        Abc_NtkTransferNameIds( pNtk, pNtkAig );
    if ( pNtk->vNameIds )
        Abc_NtkUpdateNameIds( pNtkAig );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//timeRetime = Abc_Clock() - timeRetime;
//    if ( RetValue = Abc_NtkRemoveSelfFeedLatches(pNtkAig) )
//        printf( "Modified %d self-feeding latches. The result may not verify.\n", RetValue );
    return pNtkAig;

}